

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

void ApplicativeHelper::getHeadAndArgs(TermList term,TermList *head,TermStack *args)

{
  bool bVar1;
  TermList local_28;
  
  local_28._content = term._content;
  if (args->_cursor != args->_stack) {
    args->_cursor = args->_stack;
  }
  while (bVar1 = Kernel::TermList::isApplication(&local_28), bVar1) {
    Lib::Stack<Kernel::TermList>::push
              (args,(TermList)
                    *(uint64_t *)
                     (local_28._content + 0x10 +
                     (ulong)(*(uint *)(local_28._content + 0xc) & 0xfffffff) * 8));
    local_28._content =
         *(uint64_t *)
          (local_28._content + 0x18 + (ulong)(*(uint *)(local_28._content + 0xc) & 0xfffffff) * 8);
  }
  head->_content = (uint64_t)local_28;
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(TermList term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;

}